

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GenReceiver
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  undefined8 *puVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,(anonymous_namespace)::Indent_abi_cxx11_,
             DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_48,&this->namer_,struct_def);
  uVar4 = 0xf;
  if (local_68 != local_58) {
    uVar4 = local_58[0];
  }
  if (uVar4 < (ulong)(local_40 + local_60)) {
    uVar4 = 0xf;
    if (local_48 != local_38) {
      uVar4 = local_38[0];
    }
    if ((ulong)(local_40 + local_60) <= uVar4) {
      puVar1 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
      goto LAB_0027f599;
    }
  }
  puVar1 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48);
LAB_0027f599:
  local_88 = &local_78;
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_78 = *plVar2;
    uStack_70 = puVar1[3];
  }
  else {
    local_78 = *plVar2;
    local_88 = (long *)*puVar1;
  }
  local_80 = puVar1[1];
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_98 = *plVar3;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar3;
    local_a8 = (long *)*plVar2;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,(anonymous_namespace)::Indent_abi_cxx11_,
             DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_a8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  return;
}

Assistant:

void GenReceiver(const StructDef &struct_def, std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += Indent + "# " + namer_.Type(struct_def) + "\n";
    code += Indent + "def ";
  }